

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.cpp
# Opt level: O0

Light * rw::Light::create(int32 type)

{
  FILE *__stream;
  char *pcVar1;
  EVP_PKEY_CTX *ctx;
  Error local_28;
  Error _e;
  Light *light;
  uint32 uStack_10;
  int32 type_local;
  
  _e = (Error)malloc_LOC((long)(int)s_plglist,0x30012,
                         "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/light.cpp line: 35"
                        );
  if (_e == (Error)0x0) {
    local_28.plugin = 0x12;
    local_28.code = 0x80000002;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/light.cpp",0x25);
    __stream = _stderr;
    pcVar1 = dbgsprint(0x80000002,(ulong)s_plglist);
    fprintf(__stream,"%s\n",pcVar1);
    setError(&local_28);
    uStack_10 = 0;
    type_local = 0;
  }
  else {
    numAllocated = numAllocated + 1;
    ctx = (EVP_PKEY_CTX *)0x3;
    Object::init((Object *)_e,(EVP_PKEY_CTX *)0x3);
    *(code **)((long)_e + 0x20) = lightSync;
    *(undefined4 *)((long)_e + 0x28) = 0;
    *(undefined4 *)((long)_e + 0x2c) = 0x3f800000;
    *(undefined4 *)((long)_e + 0x30) = 0x3f800000;
    *(undefined4 *)((long)_e + 0x34) = 0x3f800000;
    *(undefined4 *)((long)_e + 0x38) = 0x3f800000;
    *(undefined4 *)((long)_e + 0x3c) = 0x3f800000;
    *(undefined1 *)((long)_e + 3) = 1;
    *(undefined1 *)((long)_e + 2) = 3;
    LLLink::init((LLLink *)((long)_e + 0x40),ctx);
    *(undefined8 *)((long)_e + 0x50) = 0;
    LLLink::init((LLLink *)((long)_e + 0x58),ctx);
    *(undefined8 *)((long)_e + 0x68) = 0;
    *(undefined8 *)((long)_e + 0x70) = *(undefined8 *)((long)_e + 0x20);
    *(code **)((long)_e + 0x20) = worldLightSync;
    PluginList::construct((PluginList *)&s_plglist,(void *)_e);
    _uStack_10 = _e;
  }
  return (Light *)_uStack_10;
}

Assistant:

Light*
Light::create(int32 type)
{
	Light *light = (Light*)rwMalloc(s_plglist.size, MEMDUR_EVENT | ID_LIGHT);
	if(light == nil){
		RWERROR((ERR_ALLOC, s_plglist.size));
		return nil;
	}
	numAllocated++;
	light->object.object.init(Light::ID, type);
	light->object.syncCB = lightSync;
	light->radius = 0.0f;
	light->color.red = 1.0f;
	light->color.green = 1.0f;
	light->color.blue = 1.0f;
	light->color.alpha = 1.0f;
	light->minusCosAngle = 1.0f;
	light->object.object.privateFlags = 1;
	light->object.object.flags = LIGHTATOMICS | LIGHTWORLD;
	light->inWorld.init();

	// clump extension
	light->clump = nil;
	light->inClump.init();

	// world extension
	light->world = nil;
	light->originalSync = light->object.syncCB;
	light->object.syncCB = worldLightSync;

	s_plglist.construct(light);
	return light;
}